

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  cmMakefile *this_00;
  undefined8 uVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  cmGeneratorTarget *this_01;
  ostream *poVar9;
  string *o;
  string *objFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string reason;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string tgtName;
  char *loc;
  char *imp;
  ostringstream e;
  string local_240;
  allocator<char> local_219;
  undefined1 local_218 [32];
  string *local_1f8;
  string local_1f0;
  string local_1d0;
  char *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  local_1f8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar3,pcVar3 + pbVar2->_M_string_length);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_1f0);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Objects of target \"",0x13);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\" referenced but no such target exists.",0x27);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_240,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_240,(string *)local_218);
  }
  else {
    TVar7 = cmGeneratorTarget::GetType(this_01);
    if (TVar7 == OBJECT_LIBRARY) {
      if (context->EvaluateForBuildsystem == false) {
        pcVar4 = context->LG->GlobalGenerator;
        paVar1 = &local_240.field_2;
        local_240._M_string_length = 0;
        local_240.field_2._M_local_buf[0] = '\0';
        local_240._M_dataplus._M_p = (pointer)paVar1;
        iVar8 = (*pcVar4->_vptr_cmGlobalGenerator[0x25])(pcVar4,&local_240);
        if ((char)iVar8 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                     ,0x6c);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                              local_240._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,").  It is not suitable for writing out elsewhere.",0x31);
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_218,content);
          std::__cxx11::stringbuf::str();
          reportError(context,(string *)local_218,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((string *)local_218._0_8_ != (string *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
          }
          (local_1f8->_M_dataplus)._M_p = (pointer)&local_1f8->field_2;
          local_1f8->_M_string_length = 0;
          (local_1f8->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != paVar1) {
            operator_delete(local_240._M_dataplus._M_p,
                            CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                     local_240.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_00321cb5;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar1) {
          operator_delete(local_240._M_dataplus._M_p,
                          CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                   local_240.field_2._M_local_buf[0]) + 1);
        }
      }
      local_218._0_8_ = (string *)0x0;
      local_218._8_8_ = (string *)0x0;
      local_218._16_8_ = (pointer)0x0;
      bVar6 = cmGeneratorTarget::IsImported(this_01);
      if (bVar6) {
        local_1d0._M_dataplus._M_p = (char *)0x0;
        local_1b0 = (char *)0x0;
        local_1a8._8_8_ = 0;
        local_1a8[0x10] = '\0';
        local_1a8._0_8_ = local_1a8 + 0x10;
        bVar6 = cmTarget::GetMappedConfig
                          (this_01->Target,&context->Config,(char **)&local_1d0,&local_1b0,
                           (string *)local_1a8);
        if (bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,local_1d0._M_dataplus._M_p,&local_219);
          cmSystemTools::ExpandListArgument
                    (&local_240,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_218,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,
                            CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                     local_240.field_2._M_local_buf[0]) + 1);
          }
        }
        context->HadContextSensitiveCondition = true;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_00321ad2:
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
      else {
        cmGeneratorTarget::GetTargetObjectNames
                  (this_01,&context->Config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_218);
        local_1a8._0_8_ = local_1a8 + 0x10;
        local_1a8._8_8_ = 0;
        local_1a8[0x10] = '\0';
        if (context->EvaluateForBuildsystem == true) {
          std::__cxx11::string::_M_assign((string *)local_1a8);
        }
        else {
          cmGeneratorTarget::GetObjectDirectory(&local_240,this_01,&context->Config);
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,
                            CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                     local_240.field_2._M_local_buf[0]) + 1);
          }
          context->HadContextSensitiveCondition = true;
        }
        uVar5 = local_218._8_8_;
        if (local_218._0_8_ != local_218._8_8_) {
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_218._0_8_;
          do {
            std::operator+(&local_240,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,__rhs);
            std::__cxx11::string::operator=((string *)__rhs,(string *)&local_240);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,
                              CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                       local_240.field_2._M_local_buf[0]) + 1);
            }
            __rhs = __rhs + 1;
          } while (__rhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            uVar5);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_00321ad2;
      }
      uVar5 = local_218._8_8_;
      if (local_218._0_8_ != local_218._8_8_) {
        this_00 = context->LG->Makefile;
        objFile = (string *)local_218._0_8_;
        do {
          cmMakefile::AddTargetObject(this_00,&local_1f0,objFile);
          objFile = objFile + 1;
        } while (objFile != (string *)uVar5);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (local_1f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_218,";");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218);
      goto LAB_00321cb5;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Objects of target \"",0x13);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\" referenced but is not an OBJECT library.",0x2a);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_240,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_240,(string *)local_218);
  }
  if ((string *)local_218._0_8_ != (string *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  (local_1f8->_M_dataplus)._M_p = (pointer)&local_1f8->field_2;
  local_1f8->_M_string_length = 0;
  (local_1f8->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00321cb5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return local_1f8;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not an OBJECT library.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (!context->EvaluateForBuildsystem) {
      cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
      std::string reason;
      if (!gg->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason
          << ").  "
             "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    std::vector<std::string> objects;

    if (gt->IsImported()) {
      const char* loc = nullptr;
      const char* imp = nullptr;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, &loc, &imp, suffix)) {
        cmSystemTools::ExpandListArgument(loc, objects);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        // Here we assume that the set of object files produced
        // by an object library does not vary with configuration
        // and do not set HadContextSensitiveCondition to true.
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (std::string& o : objects) {
        o = obj_dir + o;
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::string& o : objects) {
      mf->AddTargetObject(tgtName, o);
    }

    return cmJoin(objects, ";");
  }